

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall HTTPResponse::parse(HTTPResponse *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  reference local_a0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  iterator __end1;
  iterator __begin1;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  HTTPResponse *local_10;
  HTTPResponse *this_local;
  
  local_10 = this;
  std::operator+(local_70,(char *)this);
  std::operator+(local_50,local_70);
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::operator=((string *)&this->raw,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  __end1 = std::__cxx11::
           list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->header);
  item = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::__cxx11::
            list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->header);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    local_a0 = std::
               _List_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end1);
    __rhs = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(local_a0);
    std::operator+(local_100,(char *)__rhs);
    std::get<1ul,std::__cxx11::string,std::__cxx11::string>(local_a0);
    std::operator+(local_e0,local_100);
    std::operator+(local_c0,(char *)local_e0);
    std::__cxx11::string::operator+=((string *)&this->raw,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_100);
    std::
    _List_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)&this->raw,"\r\n");
  std::__cxx11::string::operator+=((string *)&this->raw,(string *)&this->data);
  return;
}

Assistant:

void HTTPResponse::parse() {
    this->raw = this->version + " " + this->status + "\r\n";
    for (auto && item : this->header) {
        this->raw += std::get<0>(item) + ": " + std::get<1>(item) + "\r\n";
    }
    this->raw += "\r\n";
    this->raw += this->data;
}